

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumented_benchmark.cpp
# Opt level: O1

vector<double,_std::allocator<double>_> *
compute_averages(vector<double,_std::allocator<double>_> *__return_storage_ptr__,
                vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                *allresults)

{
  pointer pdVar1;
  pointer pvVar2;
  pointer pvVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer puVar6;
  byte bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  ulong uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 in_XMM4 [16];
  allocator_type local_11;
  
  pvVar2 = (allresults->
           super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((allresults->
      super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == pvVar2) {
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    std::vector<double,_std::allocator<double>_>::vector
              (__return_storage_ptr__,
               (long)(pvVar2->
                     super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar2->
                     super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>).
                     _M_impl.super__Vector_impl_data._M_start >> 3,&local_11);
    pvVar2 = (allresults->
             super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar3 = (allresults->
             super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    lVar17 = ((long)pvVar3 - (long)pvVar2 >> 3) * -0x5555555555555555;
    if (pvVar3 != pvVar2) {
      pdVar4 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl
               .super__Vector_impl_data._M_start;
      pdVar5 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl
               .super__Vector_impl_data._M_finish;
      lVar18 = (long)pdVar5 - (long)pdVar4 >> 3;
      auVar21 = vpbroadcastq_avx512f();
      lVar19 = 0;
      auVar22 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        if (pdVar5 != pdVar4) {
          puVar6 = pvVar2[lVar19].
                   super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar20 = 0;
          do {
            auVar23 = vpbroadcastq_avx512f();
            auVar23 = vporq_avx512f(auVar23,auVar22);
            uVar16 = vpcmpuq_avx512f(auVar23,auVar21,2);
            auVar23 = vmovdqu64_avx512f(*(undefined1 (*) [64])(puVar6 + uVar20));
            bVar7 = (byte)uVar16;
            auVar25._8_8_ = (ulong)((byte)(uVar16 >> 1) & 1) * auVar23._8_8_;
            auVar25._0_8_ = (ulong)(bVar7 & 1) * auVar23._0_8_;
            auVar25._16_8_ = (ulong)((byte)(uVar16 >> 2) & 1) * auVar23._16_8_;
            auVar25._24_8_ = (ulong)((byte)(uVar16 >> 3) & 1) * auVar23._24_8_;
            auVar25._32_8_ = (ulong)((byte)(uVar16 >> 4) & 1) * auVar23._32_8_;
            auVar25._40_8_ = (ulong)((byte)(uVar16 >> 5) & 1) * auVar23._40_8_;
            auVar25._48_8_ = (ulong)((byte)(uVar16 >> 6) & 1) * auVar23._48_8_;
            auVar25._56_8_ = (uVar16 >> 7) * auVar23._56_8_;
            auVar23 = vcvtuqq2pd_avx512dq(auVar25);
            pdVar1 = pdVar4 + uVar20;
            auVar24._8_8_ = (ulong)((byte)(uVar16 >> 1) & 1) * (long)pdVar1[1];
            auVar24._0_8_ = (ulong)(bVar7 & 1) * (long)*pdVar1;
            auVar24._16_8_ = (ulong)((byte)(uVar16 >> 2) & 1) * (long)pdVar1[2];
            auVar24._24_8_ = (ulong)((byte)(uVar16 >> 3) & 1) * (long)pdVar1[3];
            auVar24._32_8_ = (ulong)((byte)(uVar16 >> 4) & 1) * (long)pdVar1[4];
            auVar24._40_8_ = (ulong)((byte)(uVar16 >> 5) & 1) * (long)pdVar1[5];
            auVar24._48_8_ = (ulong)((byte)(uVar16 >> 6) & 1) * (long)pdVar1[6];
            auVar24._56_8_ = (uVar16 >> 7) * (long)pdVar1[7];
            auVar23 = vaddpd_avx512f(auVar24,auVar23);
            pdVar1 = pdVar4 + uVar20;
            bVar8 = (bool)((byte)(uVar16 >> 1) & 1);
            bVar9 = (bool)((byte)(uVar16 >> 2) & 1);
            bVar10 = (bool)((byte)(uVar16 >> 3) & 1);
            bVar11 = (bool)((byte)(uVar16 >> 4) & 1);
            bVar12 = (bool)((byte)(uVar16 >> 5) & 1);
            bVar13 = (bool)((byte)(uVar16 >> 6) & 1);
            *pdVar1 = (double)((ulong)(bVar7 & 1) * auVar23._0_8_ |
                              (ulong)!(bool)(bVar7 & 1) * (long)*pdVar1);
            pdVar1[1] = (double)((ulong)bVar8 * auVar23._8_8_ | (ulong)!bVar8 * (long)pdVar1[1]);
            pdVar1[2] = (double)((ulong)bVar9 * auVar23._16_8_ | (ulong)!bVar9 * (long)pdVar1[2]);
            pdVar1[3] = (double)((ulong)bVar10 * auVar23._24_8_ | (ulong)!bVar10 * (long)pdVar1[3]);
            pdVar1[4] = (double)((ulong)bVar11 * auVar23._32_8_ | (ulong)!bVar11 * (long)pdVar1[4]);
            pdVar1[5] = (double)((ulong)bVar12 * auVar23._40_8_ | (ulong)!bVar12 * (long)pdVar1[5]);
            pdVar1[6] = (double)((ulong)bVar13 * auVar23._48_8_ | (ulong)!bVar13 * (long)pdVar1[6]);
            pdVar1[7] = (double)((uVar16 >> 7) * auVar23._56_8_ |
                                (ulong)!SUB81(uVar16 >> 7,0) * (long)pdVar1[7]);
            uVar20 = uVar20 + 8;
          } while ((lVar18 + (ulong)(lVar18 == 0) + 7 & 0xfffffffffffffff8) != uVar20);
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 != lVar17 + (ulong)(lVar17 == 0));
    }
    pdVar4 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar18 = (long)(__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)pdVar4;
    if (lVar18 != 0) {
      lVar18 = lVar18 >> 3;
      auVar15 = vcvtusi2sd_avx512f(in_XMM4,lVar17);
      auVar21 = vpbroadcastq_avx512f();
      auVar22 = vbroadcastsd_avx512f(auVar15);
      uVar20 = 0;
      auVar23 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        auVar25 = vpbroadcastq_avx512f();
        auVar25 = vporq_avx512f(auVar25,auVar23);
        uVar16 = vpcmpuq_avx512f(auVar25,auVar21,2);
        pdVar5 = pdVar4 + uVar20;
        auVar26._8_8_ = (ulong)((byte)(uVar16 >> 1) & 1) * (long)pdVar5[1];
        auVar26._0_8_ = (ulong)((byte)uVar16 & 1) * (long)*pdVar5;
        auVar26._16_8_ = (ulong)((byte)(uVar16 >> 2) & 1) * (long)pdVar5[2];
        auVar26._24_8_ = (ulong)((byte)(uVar16 >> 3) & 1) * (long)pdVar5[3];
        auVar26._32_8_ = (ulong)((byte)(uVar16 >> 4) & 1) * (long)pdVar5[4];
        auVar26._40_8_ = (ulong)((byte)(uVar16 >> 5) & 1) * (long)pdVar5[5];
        auVar26._48_8_ = (ulong)((byte)(uVar16 >> 6) & 1) * (long)pdVar5[6];
        auVar26._56_8_ = (uVar16 >> 7) * (long)pdVar5[7];
        auVar25 = vdivpd_avx512f(auVar26,auVar22);
        pdVar5 = pdVar4 + uVar20;
        bVar8 = (bool)((byte)uVar16 & 1);
        bVar9 = (bool)((byte)(uVar16 >> 1) & 1);
        bVar10 = (bool)((byte)(uVar16 >> 2) & 1);
        bVar11 = (bool)((byte)(uVar16 >> 3) & 1);
        bVar12 = (bool)((byte)(uVar16 >> 4) & 1);
        bVar13 = (bool)((byte)(uVar16 >> 5) & 1);
        bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
        *pdVar5 = (double)((ulong)bVar8 * auVar25._0_8_ | (ulong)!bVar8 * (long)*pdVar5);
        pdVar5[1] = (double)((ulong)bVar9 * auVar25._8_8_ | (ulong)!bVar9 * (long)pdVar5[1]);
        pdVar5[2] = (double)((ulong)bVar10 * auVar25._16_8_ | (ulong)!bVar10 * (long)pdVar5[2]);
        pdVar5[3] = (double)((ulong)bVar11 * auVar25._24_8_ | (ulong)!bVar11 * (long)pdVar5[3]);
        pdVar5[4] = (double)((ulong)bVar12 * auVar25._32_8_ | (ulong)!bVar12 * (long)pdVar5[4]);
        pdVar5[5] = (double)((ulong)bVar13 * auVar25._40_8_ | (ulong)!bVar13 * (long)pdVar5[5]);
        pdVar5[6] = (double)((ulong)bVar14 * auVar25._48_8_ | (ulong)!bVar14 * (long)pdVar5[6]);
        pdVar5[7] = (double)((uVar16 >> 7) * auVar25._56_8_ |
                            (ulong)!SUB81(uVar16 >> 7,0) * (long)pdVar5[7]);
        uVar20 = uVar20 + 8;
      } while ((lVar18 + (ulong)(lVar18 == 0) + 7 & 0xfffffffffffffff8) != uVar20);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double>
compute_averages(std::vector< std::vector<unsigned long long> > allresults) {
    if (allresults.size() == 0)
        return std::vector<double>();
    
    std::vector<double> answer(allresults[0].size());
    
    for (size_t k = 0; k < allresults.size(); k++) {
        assert(allresults[k].size() == answer.size());
        for (size_t z = 0; z < answer.size(); z++) {
            answer[z] += allresults[k][z];
        }
    }

    for (size_t z = 0; z < answer.size(); z++) {
        answer[z] /= allresults.size();
    }
    return answer;
}